

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  LameWrapper *pLVar1;
  long lVar2;
  pointer ppLVar3;
  int iVar4;
  long lVar5;
  ostream *poVar6;
  long lVar7;
  pointer ppLVar8;
  Options options;
  vector<cinemo::LameWrapper_*,_std::allocator<cinemo::LameWrapper_*>_> lw;
  string workDir;
  int local_c4;
  Options local_c0;
  _Vector_base<cinemo::LameWrapper_*,_std::allocator<cinemo::LameWrapper_*>_> local_b8;
  long local_98;
  undefined1 *local_90;
  undefined8 local_88;
  undefined1 local_80 [16];
  string local_70 [32];
  string local_50 [32];
  
  lVar5 = std::chrono::_V2::system_clock::now();
  cinemo::args::printCopyrights();
  local_c0.help = false;
  local_c0.verbose = false;
  local_c0.noThread = false;
  local_90 = local_80;
  local_88 = 0;
  local_c0.quality = 3;
  local_80[0] = 0;
  local_b8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar4 = cinemo::args::processArgs
                    (argc,argv,&local_c0,
                     (vector<cinemo::LameWrapper_*,_std::allocator<cinemo::LameWrapper_*>_> *)
                     &local_b8);
  if (iVar4 < 1) {
    if (local_b8._M_impl.super__Vector_impl_data._M_finish !=
        local_b8._M_impl.super__Vector_impl_data._M_start) {
      if (local_c0.noThread == false) {
        cinemo::threading::doMultiThreadedConversion
                  ((vector<cinemo::LameWrapper_*,_std::allocator<cinemo::LameWrapper_*>_> *)
                   &local_b8,&local_c0);
      }
      else {
        cinemo::threading::doSingleThreadedConversion
                  ((vector<cinemo::LameWrapper_*,_std::allocator<cinemo::LameWrapper_*>_> *)
                   &local_b8,&local_c0);
      }
      ppLVar3 = local_b8._M_impl.super__Vector_impl_data._M_finish;
      iVar4 = 0;
      local_c4 = 0;
      local_98 = lVar5;
      for (ppLVar8 = local_b8._M_impl.super__Vector_impl_data._M_start; ppLVar8 != ppLVar3;
          ppLVar8 = ppLVar8 + 1) {
        pLVar1 = *ppLVar8;
        if (pLVar1->isDone == true) {
          iVar4 = iVar4 + 1;
        }
        else {
          poVar6 = std::operator<<((ostream *)&std::cout,"Error: \'");
          std::__cxx11::string::string(local_50,(string *)&pLVar1->file);
          poVar6 = std::operator<<(poVar6,local_50);
          poVar6 = std::operator<<(poVar6,"\' ");
          std::__cxx11::string::string(local_70,(string *)&pLVar1->message_buffer);
          poVar6 = std::operator<<(poVar6,local_70);
          std::endl<char,std::char_traits<char>>(poVar6);
          local_c4 = local_c4 + 1;
          std::__cxx11::string::~string(local_70);
          std::__cxx11::string::~string(local_50);
        }
      }
      poVar6 = std::operator<<((ostream *)&std::cout,"-------------------------------------");
      poVar6 = std::operator<<(poVar6,"\nConversion Report:\n");
      poVar6 = std::operator<<(poVar6,"\nConverted:\t");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar4);
      poVar6 = std::operator<<(poVar6,"\nSkipped:\t");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_c4);
      std::endl<char,std::char_traits<char>>(poVar6);
      lVar7 = std::chrono::_V2::system_clock::now();
      poVar6 = std::operator<<((ostream *)&std::cout,"Runtime:\t");
      lVar5 = *(long *)poVar6;
      lVar2 = *(long *)(lVar5 + -0x18);
      *(uint *)(poVar6 + lVar2 + 0x18) = *(uint *)(poVar6 + lVar2 + 0x18) & 0xfffffefb | 4;
      *(undefined8 *)(poVar6 + *(long *)(lVar5 + -0x18) + 8) = 3;
      poVar6 = std::ostream::_M_insert<double>((double)((lVar7 - local_98) / 1000000) / 1000.0);
      poVar6 = std::operator<<(poVar6,"s\n");
      poVar6 = std::operator<<(poVar6,"-------------------------------------");
      std::endl<char,std::char_traits<char>>(poVar6);
    }
    iVar4 = 0;
  }
  std::_Vector_base<cinemo::LameWrapper_*,_std::allocator<cinemo::LameWrapper_*>_>::~_Vector_base
            (&local_b8);
  std::__cxx11::string::~string((string *)&local_90);
  return iVar4;
}

Assistant:

int main(int argc, char* argv[]) {

	//Time measurement
	auto startTime = std::chrono::system_clock::now();

    args::printCopyrights();
    args::Options options;
    string workDir;
    vector<LameWrapper*> lw;

    int retVal = args::processArgs(argc, argv, options, lw);

    if (retVal > 0) { //error in arguments
        return retVal;
    }

    if (lw.size() == 0) { //no file to work on!
        return 0;
    }

    //Do the work
    if (!options.noThread) {
        threading::doMultiThreadedConversion(lw, options);
    } else { //single thread mode for comparison with -n switch
        threading::doSingleThreadedConversion(lw, options);
    }

	//write encoding results
	//TODO better to be moved into threading.cpp 
	int success = 0, failure = 0;
	for_each(begin(lw), end(lw), [&](const LameWrapper* item) {
		if (item->isFinished())
			success++;
		else {
			failure++;
			cout << "Error: '" << item->getFileName() << "' "
				<< item->getErrorMessage() << endl;
		}
	});

	cout << "-------------------------------------" 
		<< "\nConversion Report:\n"
		<< "\nConverted:\t" << success 
		<< "\nSkipped:\t" << failure << endl;

	//calculate and print total runtime
	auto elapsed = std::chrono::duration_cast<std::chrono::milliseconds>
		(std::chrono::system_clock::now() - startTime);

	cout << "Runtime:\t"
		<< std::fixed << std::setprecision(3) << elapsed.count() / 1000.0
		<< "s\n" 
		<< "-------------------------------------" << endl;

    return 0;
}